

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  string *name;
  long lVar1;
  bool bVar2;
  bool bVar3;
  TestCase *pTVar4;
  reference ppTVar5;
  char *pcVar6;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar7;
  TestInfo *pTVar8;
  reference ppTVar9;
  long in_FS_OFFSET;
  bool local_119;
  byte local_10f;
  byte local_10e;
  bool local_10d;
  bool local_10a;
  int local_c8;
  int local_c4;
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  TestInfo *test_info;
  size_t j;
  string *test_case_name;
  TestCase *test_case;
  size_t i;
  int local_70;
  int num_selected_tests;
  int num_runnable_tests;
  Int32 shard_index;
  Int32 total_shards;
  ReactionToSharding shard_tests_local;
  UnitTestImpl *this_local;
  undefined1 local_50 [8];
  string test_name;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_c4 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_c8 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_c4 = -1;
    local_c8 = -1;
  }
  local_70 = 0;
  i._4_4_ = 0;
  for (test_case = (TestCase *)0x0;
      pTVar4 = (TestCase *)
               std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                         (&this->test_cases_), test_case < pTVar4;
      test_case = (TestCase *)((long)&test_case->_vptr_TestCase + 1)) {
    ppTVar5 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,(size_type)test_case);
    pTVar4 = *ppTVar5;
    pcVar6 = TestCase::name(pTVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(test_name.field_2._M_local_buf + 8),pcVar6,
               (allocator<char> *)((long)&this_local + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&this_local + 7));
    name = (string *)((long)&test_name.field_2 + 8);
    TestCase::set_should_run(pTVar4,false);
    test_info = (TestInfo *)0x0;
    while( true ) {
      pvVar7 = TestCase::test_info_list(pTVar4);
      pTVar8 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar7);
      if (pTVar8 <= test_info) break;
      pvVar7 = TestCase::test_info_list(pTVar4);
      ppTVar9 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar7,(size_type)test_info);
      pTVar8 = *ppTVar9;
      pcVar6 = TestInfo::name(pTVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,pcVar6,(allocator<char> *)((long)&this_local + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&this_local + 6));
      bVar2 = UnitTestOptions::MatchesFilter(name,"DISABLED_*:*/DISABLED_*");
      local_10a = true;
      if (!bVar2) {
        local_10a = UnitTestOptions::MatchesFilter((string *)local_50,"DISABLED_*:*/DISABLED_*");
      }
      pTVar8->is_disabled_ = local_10a;
      bVar2 = UnitTestOptions::FilterMatchesTest(name,(string *)local_50);
      pTVar8->matches_filter_ = bVar2;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_10d = false, local_10a == false)) {
        local_10d = bVar2;
      }
      local_10e = 0;
      if (shard_tests != IGNORE_SHARDING_PROTOCOL) {
        bVar2 = ShouldRunTestOnShard(local_c4,local_c8,local_70);
        local_10e = bVar2 ^ 0xff;
      }
      pTVar8->is_in_another_shard_ = (bool)(local_10e & 1);
      local_10f = 0;
      if (local_10d != false) {
        local_10f = local_10e & 1 ^ 0xff;
      }
      bVar2 = (bool)(local_10f & 1);
      local_70 = local_70 + (uint)local_10d;
      i._4_4_ = i._4_4_ + (uint)bVar2;
      pTVar8->should_run_ = bVar2;
      bVar3 = TestCase::should_run(pTVar4);
      local_119 = true;
      if (!bVar3) {
        local_119 = bVar2;
      }
      TestCase::set_should_run(pTVar4,local_119);
      std::__cxx11::string::~string((string *)local_50);
      test_info = (TestInfo *)&(test_info->test_case_name_).field_0x1;
    }
    std::__cxx11::string::~string((string *)(test_name.field_2._M_local_buf + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return i._4_4_;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const std::string &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}